

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O0

int ConvertToDoubleMT(int OutputSettings,uchar *buf,int offset,double *pValue)

{
  uint uVar1;
  undefined4 local_4c;
  uFloat_MT uf;
  uDouble_MT ud;
  LARGE_INTEGER li;
  undefined2 local_2e;
  uInt_MT ul;
  usShort_MT uss;
  usInt_MT usl;
  double *pValue_local;
  int offset_local;
  uchar *buf_local;
  int OutputSettings_local;
  
  uVar1 = OutputSettings & 0x300;
  if (uVar1 != 0) {
    if (uVar1 == 0x100) {
      ul.c[1] = buf[offset + 2];
      ul.c[0] = buf[offset + 3];
      ul.c[2] = buf[offset + 1];
      ul.c[3] = buf[offset];
      *pValue = (double)(int)ul.v / 1048576.0;
      return offset + 4;
    }
    if (uVar1 == 0x200) {
      local_2e = CONCAT11(buf[offset + 4],buf[offset + 5]);
      li.field_0.HighPart =
           CONCAT13(buf[offset],
                    (undefined3)
                    CONCAT12(buf[offset + 1],(undefined2)CONCAT11(buf[offset + 2],buf[offset + 3])))
      ;
      *pValue = (double)CONCAT44((int)local_2e,li.field_0.HighPart) / 4294967296.0;
      return offset + 6;
    }
    if (uVar1 == 0x300) {
      *pValue = (double)CONCAT17(buf[offset],
                                 CONCAT16(buf[offset + 1],
                                          CONCAT15(buf[offset + 2],
                                                   CONCAT14(buf[offset + 3],
                                                            CONCAT13(buf[offset + 4],
                                                                     CONCAT12(buf[offset + 5],
                                                                              CONCAT11(buf[offset + 
                                                  6],buf[offset + 7])))))));
      return offset + 8;
    }
  }
  local_4c = (float)CONCAT13(buf[offset],
                             CONCAT12(buf[offset + 1],CONCAT11(buf[offset + 2],buf[offset + 3])));
  *pValue = (double)local_4c;
  return offset + 4;
}

Assistant:

inline int ConvertToDoubleMT(int OutputSettings, unsigned char* buf, int offset, double* pValue)
{
	usInt_MT usl;
	usShort_MT uss;
	uInt_MT ul;
	LARGE_INTEGER li;
	uDouble_MT ud;
	uFloat_MT uf;

	switch (OutputSettings & OUTPUT_FORMAT_MASK)
	{
	case OUTPUT_FORMAT_DOUBLE:
		ud.c[0] = buf[7+offset];
		ud.c[1] = buf[6+offset];
		ud.c[2] = buf[5+offset];
		ud.c[3] = buf[4+offset];
		ud.c[4] = buf[3+offset];
		ud.c[5] = buf[2+offset];
		ud.c[6] = buf[1+offset];
		ud.c[7] = buf[0+offset];
		*pValue = ud.v;
		return offset+8;
	case OUTPUT_FORMAT_FIXED_POINT_SIGNED_1632:
		uss.c[0] = buf[5+offset];
		uss.c[1] = buf[4+offset];
		ul.c[0] = buf[3+offset];
		ul.c[1] = buf[2+offset];
		ul.c[2] = buf[1+offset];
		ul.c[3] = buf[0+offset];
		li.HighPart = (int)uss.v;
		li.LowPart = ul.v;
		*pValue = (double)li.QuadPart/4294967296.0;
		return offset+6;
	case OUTPUT_FORMAT_FIXED_POINT_SIGNED_1220:
		usl.c[0] = buf[3+offset];
		usl.c[1] = buf[2+offset];
		usl.c[2] = buf[1+offset];
		usl.c[3] = buf[0+offset];
		*pValue = (double)usl.v/1048576.0;
		return offset+4;
	case OUTPUT_FORMAT_FLOAT:
	default:
		uf.c[0] = buf[3+offset];
		uf.c[1] = buf[2+offset];
		uf.c[2] = buf[1+offset];
		uf.c[3] = buf[0+offset];
		*pValue = (double)uf.v;
		return offset+4;
	}
}